

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2cell_id.cc
# Opt level: O2

void MaybeInit(void)

{
  int iVar1;
  long *plVar2;
  undefined8 *puVar3;
  undefined8 uVar4;
  anon_class_8_1_ba1d2be6 __callable;
  undefined1 local_19;
  undefined1 *local_18;
  
  local_18 = &local_19;
  plVar2 = (long *)__tls_get_addr(&PTR_00306d28);
  *plVar2 = (long)&local_18;
  puVar3 = (undefined8 *)__tls_get_addr(&PTR_00306b58);
  *puVar3 = std::once_flag::_Prepare_execution::
            _Prepare_execution<(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/mutex:775:25)>
            ::anon_class_1_0_00000001::__invoke;
  iVar1 = pthread_once(&flag._M_once,__once_proxy);
  if (iVar1 == 0) {
    *plVar2 = 0;
    *puVar3 = 0;
    return;
  }
  uVar4 = std::__throw_system_error(iVar1);
  *plVar2 = 0;
  *puVar3 = 0;
  _Unwind_Resume(uVar4);
}

Assistant:

inline static void MaybeInit() {
  std::call_once(flag, []{
    InitLookupCell(0, 0, 0, 0, 0, 0);
    InitLookupCell(0, 0, 0, kSwapMask, 0, kSwapMask);
    InitLookupCell(0, 0, 0, kInvertMask, 0, kInvertMask);
    InitLookupCell(0, 0, 0, kSwapMask|kInvertMask, 0, kSwapMask|kInvertMask);
  });
}